

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClass.cpp
# Opt level: O0

wstring * Microsoft::VisualStudio::CppUnitTestFramework::ToString<unsigned_char>
                    (wstring *__return_storage_ptr__,CharClass<unsigned_char> *cc)

{
  bool bVar1;
  byte bVar2;
  byte bVar3;
  _Setfill<wchar_t> _Var4;
  _Setw _Var5;
  undefined8 uVar6;
  wostream *pwVar7;
  reference this;
  Range<unsigned_char> *r;
  const_iterator __end1;
  const_iterator __begin1;
  CharClass<unsigned_char> *__range3;
  wostringstream local_190 [8];
  wostringstream os;
  CharClass<unsigned_char> *cc_local;
  
  std::__cxx11::wostringstream::wostringstream(local_190);
  uVar6 = std::wostream::operator<<(local_190,std::hex);
  _Var4 = std::setfill<wchar_t>(L'0');
  pwVar7 = std::operator<<(uVar6,_Var4._M_c);
  _Var5 = std::setw(2);
  pwVar7 = std::operator<<(pwVar7,_Var5);
  std::wostream::operator<<(pwVar7,std::showbase);
  std::wostream::put((wchar_t)local_190);
  __end1 = Centaurus::CharClass<unsigned_char>::begin(cc);
  r = (Range<unsigned_char> *)Centaurus::CharClass<unsigned_char>::end(cc);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
                                *)&r);
    if (!bVar1) break;
    this = __gnu_cxx::
           __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
           ::operator*(&__end1);
    bVar2 = Centaurus::Range<unsigned_char>::start(this);
    bVar3 = Centaurus::Range<unsigned_char>::end(this);
    if (bVar2 + 1 == (uint)bVar3) {
      bVar2 = Centaurus::Range<unsigned_char>::start(this);
      std::wostream::operator<<(local_190,(uint)bVar2);
    }
    else {
      bVar2 = Centaurus::Range<unsigned_char>::start(this);
      pwVar7 = (wostream *)std::wostream::operator<<(local_190,(uint)bVar2);
      pwVar7 = std::operator<<(pwVar7,L'-');
      bVar2 = Centaurus::Range<unsigned_char>::end(this);
      std::wostream::operator<<(pwVar7,bVar2 - 1);
    }
    std::operator<<((wostream *)local_190,L' ');
    __gnu_cxx::
    __normal_iterator<const_Centaurus::Range<unsigned_char>_*,_std::vector<Centaurus::Range<unsigned_char>,_std::allocator<Centaurus::Range<unsigned_char>_>_>_>
    ::operator++(&__end1);
  }
  std::wostream::put((wchar_t)local_190);
  std::__cxx11::wostringstream::str();
  std::__cxx11::wostringstream::~wostringstream(local_190);
  return __return_storage_ptr__;
}

Assistant:

std::wstring ToString(const Centaurus::CharClass<TCHAR>& cc)
            {
                std::wostringstream os;
                
                os << std::hex << std::setfill(L'0') << std::setw(sizeof(TCHAR) * 2) << std::showbase;
                os.put(L'[');
                for (const auto& r : cc)
                {
                    if (r.start() + 1 == r.end())
                        os << (unsigned int)r.start();
                    else
                        os << (unsigned int)r.start() << L'-' << (unsigned int)r.end() - 1;
                    os << L' ';
                }
                os.put(L']');

                return os.str();
            }